

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

void free_svm_model(svm_model *model)

{
  v_array<svm_example_*> *this;
  size_t i;
  ulong uVar1;
  
  this = &model->support_vec;
  for (uVar1 = 0; uVar1 < model->num_support; uVar1 = uVar1 + 1) {
    svm_example::~svm_example(this->_begin[uVar1]);
    free(this->_begin[uVar1]);
    this->_begin[uVar1] = (svm_example *)0x0;
  }
  v_array<svm_example_*>::delete_v(this);
  v_array<float>::delete_v(&model->alpha);
  v_array<float>::delete_v(&model->delta);
  free(model);
  return;
}

Assistant:

void free_svm_model(svm_model* model)
{
  for (size_t i = 0; i < model->num_support; i++)
  {
    model->support_vec[i]->~svm_example();
    // Warning C6001 is triggered by the following:
    // example is allocated using (a) '&calloc_or_throw<svm_example>()' and freed using (b)
    // 'free(model->support_vec[i])'
    //
    // When the call to allocation is replaced by (a) 'new svm_example()' and deallocated using (b) 'operator delete
    // (model->support_vect[i])', the warning goes away. Disable SDL warning.
    //    #pragma warning(disable:6001)
    free_it(model->support_vec[i]);
    //  #pragma warning(default:6001)

    model->support_vec[i] = 0;
  }

  model->support_vec.delete_v();
  model->alpha.delete_v();
  model->delta.delete_v();
  free(model);
}